

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int buffer_insert_pages(bfy_buffer *buf,size_t pos,bfy_page *new_pages,size_t new_len)

{
  int8_t *piVar1;
  size_t sVar2;
  size_t sVar3;
  bfy_unref_cb *pbVar4;
  undefined4 uVar5;
  ulong uVar6;
  bfy_page *pbVar7;
  ulong uVar8;
  bfy_buffer *pbVar9;
  bfy_buffer *pbVar10;
  ulong uVar11;
  size_t sVar12;
  size_t *psVar13;
  bool bVar14;
  
  if (new_pages == (bfy_page *)0x0 || new_len == 0) {
    return 0;
  }
  pbVar9 = (bfy_buffer *)buf->pages;
  if (new_len == 1) {
    if (pbVar9 == (bfy_buffer *)0x0) {
      if ((buf->page).data == (int8_t *)0x0) {
        (buf->page).unref_arg = new_pages->unref_arg;
        piVar1 = new_pages->data;
        sVar12 = new_pages->size;
        sVar2 = new_pages->read_pos;
        sVar3 = new_pages->write_pos;
        uVar5 = *(undefined4 *)&new_pages->field_0x24;
        pbVar4 = new_pages->unref_cb;
        (buf->page).flags = new_pages->flags;
        *(undefined4 *)&(buf->page).field_0x24 = uVar5;
        (buf->page).unref_cb = pbVar4;
        (buf->page).read_pos = sVar2;
        (buf->page).write_pos = sVar3;
        (buf->page).data = piVar1;
        (buf->page).size = sVar12;
        buffer_record_content_added(buf,new_pages->write_pos - new_pages->read_pos);
        return 0;
      }
      goto LAB_0014e33b;
    }
LAB_0014e320:
    pbVar7 = &pbVar9->page + buf->n_pages;
    pbVar10 = pbVar9;
  }
  else {
    if (pbVar9 != (bfy_buffer *)0x0) goto LAB_0014e320;
LAB_0014e33b:
    pbVar7 = (bfy_page *)&buf->pages;
    pbVar9 = (bfy_buffer *)0x0;
    pbVar10 = buf;
  }
  uVar8 = ((long)pbVar7 - (long)pbVar10) / 0x38 + new_len;
  if (buf->n_pages_alloc < uVar8) {
    uVar6 = 0x10;
    do {
      uVar11 = uVar6;
      uVar6 = uVar11 * 2;
    } while (uVar11 < uVar8);
    pbVar9 = (bfy_buffer *)(*allocator.realloc)(pbVar9,uVar11 * 0x38);
    if (pbVar9 == (bfy_buffer *)0x0) {
      pbVar9 = (bfy_buffer *)buf->pages;
      goto LAB_0014e388;
    }
    buf->pages = (bfy_page *)pbVar9;
    buf->n_pages_alloc = uVar11;
  }
  else {
LAB_0014e388:
    if (pbVar9 == (bfy_buffer *)0x0) {
      return -1;
    }
  }
  uVar8 = buf->n_pages;
  if (uVar8 == 0) {
    if ((buf->page).data == (int8_t *)0x0) {
      uVar8 = 0;
      goto LAB_0014e411;
    }
    buf->n_pages = 1;
    (pbVar9->page).unref_arg = (buf->page).unref_arg;
    piVar1 = (buf->page).data;
    sVar12 = (buf->page).size;
    sVar2 = (buf->page).read_pos;
    sVar3 = (buf->page).write_pos;
    uVar5 = *(undefined4 *)&(buf->page).field_0x24;
    pbVar4 = (buf->page).unref_cb;
    (pbVar9->page).flags = (buf->page).flags;
    *(undefined4 *)&(pbVar9->page).field_0x24 = uVar5;
    (pbVar9->page).unref_cb = pbVar4;
    (pbVar9->page).read_pos = sVar2;
    (pbVar9->page).write_pos = sVar3;
    (pbVar9->page).data = piVar1;
    (pbVar9->page).size = sVar12;
    (buf->page).data = (int8_t *)0x0;
    (buf->page).size = 0;
    (buf->page).unref_arg = (void *)0x0;
    (buf->page).read_pos = 0;
    (buf->page).write_pos = 0;
    *(undefined8 *)&(buf->page).flags = 0;
    (buf->page).unref_cb = (bfy_unref_cb *)0x0;
    pbVar9 = (bfy_buffer *)buf->pages;
    uVar8 = buf->n_pages;
  }
  if (pos < uVar8) {
    memmove(&pbVar9->page + pos + new_len,&pbVar9->page + pos,(uVar8 - pos) * 0x38);
    pbVar9 = (bfy_buffer *)buf->pages;
    uVar8 = pos;
  }
LAB_0014e411:
  memcpy(&pbVar9->page + uVar8,new_pages,new_len * 0x38);
  buf->n_pages = buf->n_pages + new_len;
  psVar13 = &new_pages->write_pos;
  sVar12 = 0;
  while (bVar14 = new_len != 0, new_len = new_len - 1, bVar14) {
    sVar12 = (sVar12 + *psVar13) - psVar13[-1];
    psVar13 = psVar13 + 7;
  }
  buffer_record_content_added(buf,sVar12);
  return 0;
}

Assistant:

static int
buffer_insert_pages(bfy_buffer* buf, size_t pos,
                    struct bfy_page const* new_pages,
                    size_t new_len) {
    if (new_len == 0 || new_pages == NULL) {
        return 0;
    }

    // if we have nothing, use buf->page
    if (new_len == 1 && buf->pages == NULL && buf->page.data == NULL) {
        buf->page = *new_pages;
        buffer_record_content_added(buf, page_get_content_len(new_pages));
        return 0;
    }

    // ensure we have enough space in buf->pages
    size_t n_pages_alloc = buffer_count_pages(buf) + new_len;
    size_t const pagesize = sizeof(struct bfy_page);
    if (n_pages_alloc > buf->n_pages_alloc) {
        n_pages_alloc = pick_capacity(16, n_pages_alloc);
        void* pages = allocator.realloc(buf->pages, pagesize * n_pages_alloc);
        if (pages != NULL) {
            buf->pages = pages;
            buf->n_pages_alloc = n_pages_alloc;
        }
    }
    if (buf->pages == NULL) {
        return -1;
    }

    // if we had 1 page and are inserting more, handle the special case
    // of moving the single buf->page into the multipage array
    if (buf->n_pages == 0 && buf->page.data != NULL) {
        buf->n_pages = 1;
        *buf->pages = buf->page;
        buf->page = InitPage;
    }

    // insert new_pages into buf->pages
    pos = size_t_min(pos, buf->n_pages);
    if (buf->n_pages > pos) {
        memmove(buf->pages + pos + new_len, buf->pages + pos, pagesize * (buf->n_pages - pos));
    }
    memcpy(buf->pages + pos, new_pages, pagesize * new_len);
    buf->n_pages += new_len;

    // record the new content
    size_t new_content_len = 0;
    for (size_t i = 0; i < new_len; ++i) {
        new_content_len += page_get_content_len(new_pages + i);
    }
    buffer_record_content_added(buf, new_content_len);
    return 0;
}